

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_transaction.cpp
# Opt level: O1

void __thiscall
duckdb::DuckTransaction::PushCatalogEntry
          (DuckTransaction *this,CatalogEntry *entry,data_ptr_t extra_data,idx_t extra_data_size)

{
  data_ptr_t pdVar1;
  idx_t len;
  UndoBufferReference undo_entry;
  UndoBufferReference local_40;
  
  len = 8;
  if (extra_data_size != 0) {
    len = extra_data_size + 0x10;
  }
  UndoBuffer::CreateEntry(&local_40,&this->undo_buffer,CATALOG_ENTRY,len);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_40.handle.node);
  pdVar1 = (local_40.handle.node.ptr)->buffer;
  *(CatalogEntry **)(pdVar1 + local_40.position) = entry;
  if (extra_data_size != 0) {
    *(idx_t *)(pdVar1 + local_40.position + 8) = extra_data_size;
    switchD_012dd528::default(pdVar1 + local_40.position + 0x10,extra_data,extra_data_size);
  }
  BufferHandle::~BufferHandle(&local_40.handle);
  return;
}

Assistant:

void DuckTransaction::PushCatalogEntry(CatalogEntry &entry, data_ptr_t extra_data, idx_t extra_data_size) {
	idx_t alloc_size = sizeof(CatalogEntry *);
	if (extra_data_size > 0) {
		alloc_size += extra_data_size + sizeof(idx_t);
	}

	auto undo_entry = undo_buffer.CreateEntry(UndoFlags::CATALOG_ENTRY, alloc_size);
	auto ptr = undo_entry.Ptr();
	// store the pointer to the catalog entry
	Store<CatalogEntry *>(&entry, ptr);
	if (extra_data_size > 0) {
		// copy the extra data behind the catalog entry pointer (if any)
		ptr += sizeof(CatalogEntry *);
		// first store the extra data size
		Store<idx_t>(extra_data_size, ptr);
		ptr += sizeof(idx_t);
		// then copy over the actual data
		memcpy(ptr, extra_data, extra_data_size);
	}
}